

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O0

Pipeline * __thiscall
n_e_s::core::Mos6502::create_load_instruction
          (Pipeline *__return_storage_ptr__,Mos6502 *this,Opcode opcode)

{
  Family family;
  anon_class_24_3_c2b0929d local_f0;
  StepT local_d8;
  Pipeline local_a8;
  undefined1 local_4d;
  MemoryAccess local_4c;
  uint8_t *puStack_48;
  MemoryAccess memory_access;
  uint8_t *reg2;
  uint8_t *reg;
  Mos6502 *this_local;
  AddressMode local_24;
  undefined8 local_1c;
  Opcode opcode_local;
  Pipeline *result;
  
  local_24 = opcode.address_mode;
  register0x00000010 = opcode._0_8_;
  reg2 = (uint8_t *)0x0;
  puStack_48 = (uint8_t *)0x0;
  local_1c._0_4_ = opcode.family;
  family = (Family)local_1c;
  if ((Family)local_1c == LDX) {
    reg2 = &this->registers_->x;
  }
  else if ((Family)local_1c == LDY) {
    reg2 = &this->registers_->y;
  }
  else if ((Family)local_1c == LDA) {
    reg2 = &this->registers_->a;
  }
  else if ((Family)local_1c == LAX) {
    reg2 = &this->registers_->a;
    puStack_48 = &this->registers_->x;
  }
  reg = (uint8_t *)this;
  local_1c = register0x00000010;
  opcode_local.family = local_24;
  opcode_local._4_8_ = __return_storage_ptr__;
  local_4c = get_memory_access(family);
  local_4d = 0;
  Pipeline::Pipeline(__return_storage_ptr__);
  create_addressing_steps(&local_a8,this,opcode_local.family,local_4c);
  Pipeline::append(__return_storage_ptr__,&local_a8);
  Pipeline::~Pipeline(&local_a8);
  local_f0.reg = reg2;
  local_f0.reg2 = puStack_48;
  local_f0.this = this;
  std::function<void()>::
  function<n_e_s::core::Mos6502::create_load_instruction(n_e_s::core::Opcode)::__0,void>
            ((function<void()> *)&local_d8,&local_f0);
  Pipeline::push(__return_storage_ptr__,&local_d8);
  std::function<void_()>::~function(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_load_instruction(Opcode opcode) {
    uint8_t *reg{};
    uint8_t *reg2{};
    if (opcode.family == Family::LDX) {
        reg = &registers_->x;
    } else if (opcode.family == Family::LDY) {
        reg = &registers_->y;
    } else if (opcode.family == Family::LDA) {
        reg = &registers_->a;
    } else if (opcode.family == Family::LAX) {
        reg = &registers_->a;
        reg2 = &registers_->x;
    }

    const MemoryAccess memory_access = get_memory_access(opcode.family);
    Pipeline result;
    result.append(create_addressing_steps(opcode.address_mode, memory_access));

    result.push([this, reg, reg2] {
        const uint8_t value = mmu_->read_byte(effective_address_);
        *reg = value;
        set_zero(value);
        set_negative(value);
        if (reg2) {
            *reg2 = value;
        }
    });

    return result;
}